

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O0

plutovg_state_t * plutovg_state_create(void)

{
  plutovg_state_t *ppVar1;
  plutovg_state_t *state;
  
  ppVar1 = (plutovg_state_t *)malloc(0xa0);
  ppVar1->paint = (plutovg_paint_t *)0x0;
  ppVar1->font_face = (plutovg_font_face_t *)0x0;
  (ppVar1->color).r = 0.0;
  (ppVar1->color).g = 0.0;
  (ppVar1->color).b = 0.0;
  (ppVar1->color).a = 1.0;
  (ppVar1->matrix).a = 1.0;
  (ppVar1->matrix).b = 0.0;
  (ppVar1->matrix).c = 0.0;
  (ppVar1->matrix).d = 1.0;
  (ppVar1->matrix).e = 0.0;
  (ppVar1->matrix).f = 0.0;
  (ppVar1->stroke).style.width = 1.0;
  (ppVar1->stroke).style.cap = PLUTOVG_LINE_CAP_BUTT;
  (ppVar1->stroke).style.join = PLUTOVG_LINE_JOIN_MITER;
  (ppVar1->stroke).style.miter_limit = 10.0;
  (ppVar1->stroke).dash.offset = 0.0;
  (ppVar1->stroke).dash.array.data = (float *)0x0;
  (ppVar1->stroke).dash.array.size = 0;
  (ppVar1->stroke).dash.array.capacity = 0;
  plutovg_span_buffer_init(&ppVar1->clip_spans);
  ppVar1->winding = PLUTOVG_FILL_RULE_NON_ZERO;
  ppVar1->op = PLUTOVG_OPERATOR_SRC_OVER;
  ppVar1->font_size = 12.0;
  ppVar1->opacity = 1.0;
  ppVar1->clipping = false;
  ppVar1->next = (plutovg_state *)0x0;
  return ppVar1;
}

Assistant:

static plutovg_state_t* plutovg_state_create(void)
{
    plutovg_state_t* state = malloc(sizeof(plutovg_state_t));
    state->paint = NULL;
    state->font_face = NULL;
    state->color = PLUTOVG_BLACK_COLOR;
    state->matrix = PLUTOVG_IDENTITY_MATRIX;
    state->stroke.style = PLUTOVG_DEFAULT_STROKE_STYLE;
    state->stroke.dash.offset = 0.f;
    plutovg_array_init(state->stroke.dash.array);
    plutovg_span_buffer_init(&state->clip_spans);
    state->winding = PLUTOVG_FILL_RULE_NON_ZERO;
    state->op = PLUTOVG_OPERATOR_SRC_OVER;
    state->font_size = 12.f;
    state->opacity = 1.f;
    state->clipping = false;
    state->next = NULL;
    return state;
}